

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

int FColorCVar::ToInt2(UCVarValue value,ECVarType type)

{
  int iVar1;
  FString *pFVar2;
  FString string;
  UCVarValue local_20;
  FString local_18;
  
  if (type == CVAR_String) {
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    local_20.String = FString::NullString.Nothing;
    if (screen != (DFrameBuffer *)0x0) {
      V_GetColorStringByName((char *)&local_18,(FScriptPosition *)value.pGUID);
      pFVar2 = FString::operator=((FString *)&local_20,&local_18);
      iVar1 = *(int *)(pFVar2->Chars + -0xc);
      FString::~FString(&local_18);
      if (iVar1 != 0) {
        value = local_20;
      }
    }
    iVar1 = V_GetColorFromString((DWORD *)0x0,value.String,(FScriptPosition *)0x0);
    FString::~FString((FString *)&local_20);
    return iVar1;
  }
  iVar1 = FBaseCVar::ToInt(value,type);
  return iVar1;
}

Assistant:

int FColorCVar::ToInt2 (UCVarValue value, ECVarType type)
{
	int ret;

	if (type == CVAR_String)
	{
		FString string;
		// Only allow named colors after the screen exists (i.e. after
		// we've got some lumps loaded, so X11R6RGB can be read). Since
		// the only time this might be called before that is when loading
		// zdoom.ini, this shouldn't be a problem.
		if (screen && !(string = V_GetColorStringByName (value.String)).IsEmpty() )
		{
			ret = V_GetColorFromString (NULL, string);
		}
		else
		{
			ret = V_GetColorFromString (NULL, value.String);
		}
	}
	else
	{
		ret = ToInt (value, type);
	}
	return ret;
}